

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

void Ivy_TruthDsdPrint_rec(FILE *pFile,int iNode,Vec_Int_t *vTree)

{
  int m;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int Var0;
  int Var1;
  int VarC;
  Ivy_Dec_t Node;
  int i;
  int Var;
  Vec_Int_t *vTree_local;
  int iNode_local;
  FILE *pFile_local;
  
  m = Vec_IntEntry(vTree,iNode);
  Var1 = (int)Ivy_IntToDec(m);
  if ((Var1 & 0xfU) == 1) {
    pcVar4 = "";
    if (((uint)Var1 >> 4 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,"Const1%s",pcVar4);
  }
  else if ((Var1 & 0xfU) == 0) {
    pcVar4 = "";
    if (((uint)Var1 >> 4 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,"%c%s",(ulong)(iNode + 0x61),pcVar4);
  }
  else if ((Var1 & 0xfU) == 2) {
    Ivy_TruthDsdPrint_rec(pFile,(int)((uint)Var1 >> 8 & 0xf) >> 1,vTree);
    pcVar4 = "";
    if (((uint)Var1 >> 4 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,"%s",pcVar4);
  }
  else if ((Var1 & 0xfU) == 3) {
    fprintf((FILE *)pFile,"AND(");
    for (VarC = 0; VarC < (int)((uint)Var1 >> 5 & 7); VarC = VarC + 1) {
      Node = (Ivy_Dec_t)Ivy_DecGetVar((Ivy_Dec_t *)&Var1,VarC);
      Ivy_TruthDsdPrint_rec(pFile,(int)Node >> 1,vTree);
      pcVar4 = "";
      if (((uint)Node & 1) != 0) {
        pcVar4 = "\'";
      }
      fprintf((FILE *)pFile,"%s",pcVar4);
      if (VarC != ((uint)Var1 >> 5 & 7) - 1) {
        fprintf((FILE *)pFile,",");
      }
    }
    pcVar4 = "";
    if (((uint)Var1 >> 4 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,")%s",pcVar4);
  }
  else if ((Var1 & 0xfU) == 4) {
    fprintf((FILE *)pFile,"EXOR(");
    for (VarC = 0; VarC < (int)((uint)Var1 >> 5 & 7); VarC = VarC + 1) {
      Node = (Ivy_Dec_t)Ivy_DecGetVar((Ivy_Dec_t *)&Var1,VarC);
      Ivy_TruthDsdPrint_rec(pFile,(int)Node >> 1,vTree);
      if (VarC != ((uint)Var1 >> 5 & 7) - 1) {
        fprintf((FILE *)pFile,",");
      }
      if (((uint)Node & 1) != 0) {
        __assert_fail("(Var & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x213,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
      }
    }
    pcVar4 = "";
    if (((uint)Var1 >> 4 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,")%s",pcVar4);
  }
  else {
    if (((Var1 & 0xfU) != 5) && ((Var1 & 0xfU) != 6)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x229,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
    }
    if (((uint)Var1 >> 4 & 1) != 0) {
      __assert_fail("Node.fCompl == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x21a,"void Ivy_TruthDsdPrint_rec(FILE *, int, Vec_Int_t *)");
    }
    uVar1 = Ivy_DecGetVar((Ivy_Dec_t *)&Var1,0);
    uVar2 = Ivy_DecGetVar((Ivy_Dec_t *)&Var1,1);
    uVar3 = Ivy_DecGetVar((Ivy_Dec_t *)&Var1,2);
    pcVar4 = "MAJ(";
    if ((Var1 & 0xfU) == 5) {
      pcVar4 = "MUX(";
    }
    fprintf((FILE *)pFile,"%s",pcVar4);
    Ivy_TruthDsdPrint_rec(pFile,(int)uVar1 >> 1,vTree);
    pcVar4 = "";
    if ((uVar1 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,"%s",pcVar4);
    fprintf((FILE *)pFile,",");
    Ivy_TruthDsdPrint_rec(pFile,(int)uVar2 >> 1,vTree);
    pcVar4 = "";
    if ((uVar2 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,"%s",pcVar4);
    fprintf((FILE *)pFile,",");
    Ivy_TruthDsdPrint_rec(pFile,(int)uVar3 >> 1,vTree);
    pcVar4 = "";
    if ((uVar3 & 1) != 0) {
      pcVar4 = "\'";
    }
    fprintf((FILE *)pFile,"%s",pcVar4);
    fprintf((FILE *)pFile,")");
  }
  return;
}

Assistant:

void Ivy_TruthDsdPrint_rec( FILE * pFile, int iNode, Vec_Int_t * vTree )
{
    int Var, i;
    // get the node
    Ivy_Dec_t Node = Ivy_IntToDec( Vec_IntEntry(vTree, iNode) );
    // compute the node function
    if ( Node.Type == IVY_DEC_CONST1 )
        fprintf( pFile, "Const1%s", (Node.fCompl? "\'" : "") );
    else if ( Node.Type == IVY_DEC_PI )
        fprintf( pFile, "%c%s", 'a' + iNode, (Node.fCompl? "\'" : "") );
    else if ( Node.Type == IVY_DEC_BUF )
    {
        Ivy_TruthDsdPrint_rec( pFile, Node.Fan0 >> 1, vTree );
        fprintf( pFile, "%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_AND )
    {
        fprintf( pFile, "AND(" );
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            Ivy_TruthDsdPrint_rec( pFile, Var >> 1, vTree );
            fprintf( pFile, "%s", (Var & 1)? "\'" : "" );
            if ( i != (int)Node.nFans-1 )
                fprintf( pFile, "," );
        }
        fprintf( pFile, ")%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
    {
        fprintf( pFile, "EXOR(" );
        for ( i = 0; i < (int)Node.nFans; i++ )
        {
            Var = Ivy_DecGetVar( &Node, i );
            Ivy_TruthDsdPrint_rec( pFile, Var >> 1, vTree );
            if ( i != (int)Node.nFans-1 )
                fprintf( pFile, "," );
            assert( (Var & 1) == 0 );
        }
        fprintf( pFile, ")%s", (Node.fCompl? "\'" : "") );
    }
    else if ( Node.Type == IVY_DEC_MUX || Node.Type == IVY_DEC_MAJ )
    {
        int VarC, Var1, Var0;
        assert( Node.fCompl == 0 );
        VarC = Ivy_DecGetVar( &Node, 0 );
        Var1 = Ivy_DecGetVar( &Node, 1 );
        Var0 = Ivy_DecGetVar( &Node, 2 );
        fprintf( pFile, "%s", (Node.Type == IVY_DEC_MUX)? "MUX(" : "MAJ(" );
        Ivy_TruthDsdPrint_rec( pFile, VarC >> 1, vTree );
        fprintf( pFile, "%s", (VarC & 1)? "\'" : "" );
        fprintf( pFile, "," );
        Ivy_TruthDsdPrint_rec( pFile, Var1 >> 1, vTree );
        fprintf( pFile, "%s", (Var1 & 1)? "\'" : "" );
        fprintf( pFile, "," );
        Ivy_TruthDsdPrint_rec( pFile, Var0 >> 1, vTree );
        fprintf( pFile, "%s", (Var0 & 1)? "\'" : "" );
        fprintf( pFile, ")" );
    }
    else assert( 0 );
}